

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

void __thiscall wasm::SExpressionWasmBuilder::parseData(SExpressionWasmBuilder *this,Element *s)

{
  int iVar1;
  IString str;
  Expression *init;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  Element *pEVar5;
  Element *pEVar6;
  pointer pDVar7;
  IString str_00;
  Name memory_00;
  Name name_00;
  Address local_100;
  char *local_f8;
  size_t sStack_f0;
  char *local_e8;
  size_t sStack_e0;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> local_d0;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> seg;
  Element *inner;
  string_view local_a0;
  Element *local_90;
  Element *inner_1;
  char *local_80;
  string_view local_78;
  Name local_68;
  Expression *local_58;
  Expression *offset;
  undefined1 auStack_48 [7];
  bool isPassive;
  Name memory;
  undefined1 auStack_30 [7];
  bool hasExplicitName;
  Name name;
  Index i;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  
  name.super_IString.str._M_str._4_4_ = 1;
  iVar1 = this->dataCounter;
  this->dataCounter = iVar1 + 1;
  _auStack_30 = (string_view)wasm::Name::fromInt((long)iVar1);
  memory.super_IString.str._M_str._7_1_ = 0;
  wasm::Name::Name((Name *)auStack_48);
  offset._7_1_ = 1;
  local_58 = (Expression *)0x0;
  pEVar5 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
  bVar3 = Element::isStr(pEVar5);
  if (bVar3) {
    pEVar5 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
    bVar3 = Element::dollared(pEVar5);
    uVar4 = name.super_IString.str._M_str._4_4_;
    if (bVar3) {
      name.super_IString.str._M_str._4_4_ = name.super_IString.str._M_str._4_4_ + 1;
      pEVar5 = Element::operator[](s,uVar4);
      local_78 = (string_view)Element::str(pEVar5);
      wasm::Name::Name(&local_68,(IString)local_78);
      wasm::Name::operator=((Name *)auStack_30,&local_68);
      memory.super_IString.str._M_str._7_1_ = 1;
    }
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&this->dataSegmentNames,(value_type *)auStack_30);
  pEVar5 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
  bVar3 = Element::isList(pEVar5);
  if (bVar3) {
    pEVar6 = Element::operator[](s,name.super_IString.str._M_str._4_4_);
    inner_1 = MEMORY;
    local_80 = DAT_027e5790;
    str.str._M_str = DAT_027e5790;
    str.str._M_len = (size_t)MEMORY;
    pEVar5 = MEMORY;
    bVar3 = elementStartsWith(pEVar6,str);
    uVar4 = name.super_IString.str._M_str._4_4_;
    if (bVar3) {
      name.super_IString.str._M_str._4_4_ = name.super_IString.str._M_str._4_4_ + 1;
      local_90 = Element::operator[](s,uVar4);
      pEVar6 = Element::operator[](local_90,1);
      local_a0 = (string_view)getMemoryName(this,pEVar6);
      wasm::Name::operator=((Name *)auStack_48,(Name *)&local_a0);
    }
    else {
      _inner = (string_view)getMemoryNameAtIdx(this,0);
      wasm::Name::operator=((Name *)auStack_48,(Name *)&inner);
    }
    uVar4 = name.super_IString.str._M_str._4_4_;
    name.super_IString.str._M_str._4_4_ = name.super_IString.str._M_str._4_4_ + 1;
    pEVar6 = Element::operator[](s,uVar4);
    seg._M_t.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
    super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)
         (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)
         OFFSET._M_head_impl;
    str_00.str._M_str = &pEVar5->isList_;
    str_00.str._M_len = DAT_027e5a90;
    bVar3 = elementStartsWith((wasm *)pEVar6,(Element *)OFFSET._M_head_impl,str_00);
    if (bVar3) {
      pEVar5 = Element::operator[](pEVar6,1);
      local_58 = parseExpression(this,pEVar5);
    }
    else {
      local_58 = parseExpression(this,pEVar6);
    }
    offset._7_1_ = 0;
  }
  init = local_58;
  local_e8 = _auStack_30;
  sStack_e0 = name.super_IString.str._M_len;
  local_f8 = _auStack_48;
  sStack_f0 = memory.super_IString.str._M_len;
  uVar4 = (uint)offset._7_1_;
  wasm::Address::Address(&local_100,0);
  memory_00.super_IString.str._M_str = local_f8;
  memory_00.super_IString.str._M_len = sStack_e0;
  name_00.super_IString.str._M_str = local_e8;
  name_00.super_IString.str._M_len = (size_t)&local_d0;
  Builder::makeDataSegment
            (name_00,memory_00,SUB81(sStack_f0,0),(Expression *)(ulong)(uVar4 & 1),(char *)init,
             (Address)0x218005f);
  bVar2 = memory.super_IString.str._M_str._7_1_;
  pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_d0);
  (pDVar7->super_Named).hasExplicitName = (bool)(bVar2 & 1);
  parseInnerData(this,s,name.super_IString.str._M_str._4_4_,&local_d0);
  Module::addDataSegment(this->wasm,&local_d0);
  std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
            (&local_d0);
  return;
}

Assistant:

void SExpressionWasmBuilder::parseData(Element& s) {
  Index i = 1;
  Name name = Name::fromInt(dataCounter++);
  bool hasExplicitName = false;
  Name memory;
  bool isPassive = true;
  Expression* offset = nullptr;

  if (s[i]->isStr() && s[i]->dollared()) {
    name = s[i++]->str();
    hasExplicitName = true;
  }
  dataSegmentNames.push_back(name);

  if (s[i]->isList()) {
    // Optional (memory <memoryidx>)
    if (elementStartsWith(s[i], MEMORY)) {
      auto& inner = *s[i++];
      memory = getMemoryName(*inner[1]);
    } else {
      memory = getMemoryNameAtIdx(0);
    }
    // Offset expression (offset (<expr>)) | (<expr>)
    auto& inner = *s[i++];
    if (elementStartsWith(inner, OFFSET)) {
      offset = parseExpression(inner[1]);
    } else {
      offset = parseExpression(inner);
    }
    isPassive = false;
  }

  auto seg = Builder::makeDataSegment(name, memory, isPassive, offset);
  seg->hasExplicitName = hasExplicitName;
  parseInnerData(s, i, seg);
  wasm.addDataSegment(std::move(seg));
}